

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness,
          bool anti_aliased)

{
  ImVec2 IVar1;
  bool bVar2;
  long lVar3;
  ImVec2 *pIVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 *pIVar7;
  ImVec2 *pIVar8;
  ImDrawIdx IVar9;
  ImDrawIdx IVar10;
  long lVar11;
  long lVar12;
  undefined7 in_register_00000081;
  float fVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  undefined8 uStack_2e0;
  ImVec2 IStack_2d8;
  int local_2cc;
  ImVec2 local_2c8 [2];
  ImVec2 *local_2b8;
  float local_2b0;
  float local_2ac;
  ImVec2 *local_2a8;
  ImVec2 *local_2a0;
  ImVec2 *local_298;
  ImVec2 *local_290;
  ImVec2 *local_288;
  ImVec2 *local_280;
  ImVec2 *local_278;
  float local_26c;
  ImVec2 *local_268;
  ImVec2 *local_260;
  float local_258;
  float local_254;
  ImVec2 *local_250;
  ImVec2 *local_248;
  ImVec2 *local_240;
  float local_234;
  ImVec2 *local_230;
  float local_228;
  uint local_224;
  int local_220;
  undefined4 local_21c;
  ImU32 local_218;
  int local_214;
  ImVec2 *local_210;
  ImDrawList *local_208;
  float local_200;
  float local_1fc;
  float dy;
  float dx;
  ImVec2 diff_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1d8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_1;
  ImVec2 local_1a8;
  ImVec2 dm_in;
  ImVec2 dm_out;
  float scale_1;
  float dmr2_1;
  ImVec2 local_188;
  ImVec2 dm_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  float local_f0;
  int local_ec;
  float half_inner_thickness;
  int i;
  ImVec2 local_e0;
  float local_d8;
  float local_d4;
  float scale;
  float dmr2;
  ImVec2 local_c8;
  ImVec2 dm;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 diff;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 uv;
  bool anti_aliased_local;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  local_21c = (undefined4)CONCAT71(in_register_00000081,closed);
  if (1 < points_count) {
    IVar1 = GImGui->FontTexUvWhitePixel;
    AA_SIZE = (float)points_count;
    if (!closed) {
      AA_SIZE = (float)(points_count + -1);
    }
    bVar2 = 1.0 < thickness;
    local_218 = col;
    local_214 = points_count;
    local_210 = points;
    local_208 = this;
    if ((anti_aliased & (GImGui->Style).AntiAliasedLines & 1U) == 0) {
      uStack_2e0 = 0x1e771f;
      PrimReserve(this,(int)AA_SIZE * 6,(int)AA_SIZE << 2);
      for (local_1d8 = 0; local_1d8 < (int)AA_SIZE; local_1d8 = local_1d8 + 1) {
        if (local_1d8 + 1 == points_count) {
          local_2cc = 0;
        }
        else {
          local_2cc = local_1d8 + 1;
        }
        pIVar7 = points + local_1d8;
        diff_1 = (ImVec2)(points + local_2cc);
        uStack_2e0 = 0x1e77aa;
        _dy = ::operator-((ImVec2 *)diff_1,pIVar7);
        uStack_2e0 = 0x1e77c6;
        fVar13 = ImInvLength((ImVec2 *)&dy,1.0);
        uStack_2e0 = 0x1e77d2;
        operator*=((ImVec2 *)&dy,fVar13);
        local_1fc = dy * thickness * 0.5;
        local_200 = dx * thickness * 0.5;
        (local_208->_VtxWritePtr->pos).x = pIVar7->x + local_200;
        (local_208->_VtxWritePtr->pos).y = pIVar7->y - local_1fc;
        local_208->_VtxWritePtr->uv = IVar1;
        local_208->_VtxWritePtr->col = col;
        local_208->_VtxWritePtr[1].pos.x = *(float *)diff_1 + local_200;
        local_208->_VtxWritePtr[1].pos.y = *(float *)((long)diff_1 + 4) - local_1fc;
        local_208->_VtxWritePtr[1].uv = IVar1;
        local_208->_VtxWritePtr[1].col = col;
        local_208->_VtxWritePtr[2].pos.x = *(float *)diff_1 - local_200;
        local_208->_VtxWritePtr[2].pos.y = *(float *)((long)diff_1 + 4) + local_1fc;
        local_208->_VtxWritePtr[2].uv = IVar1;
        local_208->_VtxWritePtr[2].col = col;
        local_208->_VtxWritePtr[3].pos.x = pIVar7->x - local_200;
        local_208->_VtxWritePtr[3].pos.y = pIVar7->y + local_1fc;
        local_208->_VtxWritePtr[3].uv = IVar1;
        local_208->_VtxWritePtr[3].col = col;
        local_208->_VtxWritePtr = local_208->_VtxWritePtr + 4;
        *local_208->_IdxWritePtr = (ImDrawIdx)local_208->_VtxCurrentIdx;
        local_208->_IdxWritePtr[1] = (short)local_208->_VtxCurrentIdx + 1;
        local_208->_IdxWritePtr[2] = (short)local_208->_VtxCurrentIdx + 2;
        local_208->_IdxWritePtr[3] = (ImDrawIdx)local_208->_VtxCurrentIdx;
        local_208->_IdxWritePtr[4] = (short)local_208->_VtxCurrentIdx + 2;
        local_208->_IdxWritePtr[5] = (short)local_208->_VtxCurrentIdx + 3;
        local_208->_IdxWritePtr = local_208->_IdxWritePtr + 6;
        local_208->_VtxCurrentIdx = local_208->_VtxCurrentIdx + 4;
      }
    }
    else {
      uVar6 = col & 0xffffff;
      if (bVar2) {
        local_220 = (int)AA_SIZE * 0x12;
        local_224 = points_count << 2;
      }
      else {
        local_220 = (int)AA_SIZE * 0xc;
        local_224 = points_count * 3;
      }
      uVar5 = local_224;
      uStack_2e0 = 0x1e676b;
      PrimReserve(this,local_220,local_224);
      lVar3 = -((long)(int)(points_count * ((uint)bVar2 * 2 + 3)) * 8 + 0xfU & 0xfffffffffffffff0);
      pIVar7 = (ImVec2 *)((long)&IStack_2d8 + lVar3);
      pIVar8 = pIVar7 + points_count;
      for (diff.y = 0.0; (int)diff.y < (int)AA_SIZE; diff.y = (float)((int)diff.y + 1)) {
        if ((int)diff.y + 1 == points_count) {
          local_228 = 0.0;
        }
        else {
          local_228 = (float)((int)diff.y + 1);
        }
        diff.x = local_228;
        lVar11 = (long)(int)local_228;
        lVar12 = (long)(int)diff.y;
        *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6802;
        local_70 = ::operator-(points + lVar11,points + lVar12);
        *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6818;
        fVar13 = ImInvLength(&local_70,1.0);
        *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6821;
        operator*=(&local_70,fVar13);
        pIVar7[(int)diff.y].x = local_70.y;
        *(float *)((long)&IStack_2d8 + (long)(int)diff.y * 8 + lVar3 + 4) = -local_70.x;
      }
      if (!closed) {
        pIVar7[points_count + -1] = pIVar7[points_count + -2];
      }
      if (bVar2) {
        local_f0 = (thickness - 1.0) * 0.5;
        if (!closed) {
          local_26c = 1.0;
          fVar13 = local_f0 + 1.0;
          local_2a8 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6e6f;
          local_100 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_2a8;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6e8a;
          local_f8 = operator+(pIVar4,&local_100);
          *pIVar8 = local_f8;
          fVar13 = local_f0;
          local_2a0 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6ebc;
          local_110 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_2a0;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6ed7;
          local_108 = operator+(pIVar4,&local_110);
          pIVar8[1] = local_108;
          fVar13 = local_f0;
          local_298 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6f0a;
          local_120 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_298;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6f25;
          local_118 = ::operator-(pIVar4,&local_120);
          fVar13 = local_26c;
          pIVar8[2] = local_118;
          fVar13 = local_f0 + fVar13;
          local_290 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6f64;
          local_130 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_290;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6f7f;
          local_128 = ::operator-(pIVar4,&local_130);
          fVar13 = local_26c;
          pIVar8[3] = local_128;
          local_288 = points + (points_count + -1);
          fVar13 = local_f0 + fVar13;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6fce;
          local_140 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_288;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6fe9;
          IVar14 = operator+(pIVar4,&local_140);
          fVar13 = local_f0;
          pIVar8[points_count * 4 + -4] = IVar14;
          local_280 = points + (points_count + -1);
          local_138 = IVar14;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e703b;
          local_150 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_280;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7056;
          IVar14 = operator+(pIVar4,&local_150);
          fVar13 = local_f0;
          pIVar8[(long)(points_count * 4 + -4) + 1] = IVar14;
          local_278 = points + (points_count + -1);
          local_148 = IVar14;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e70a9;
          local_160 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_278;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e70c4;
          IVar14 = ::operator-(pIVar4,&local_160);
          pIVar8[(long)(points_count * 4 + -4) + 2] = IVar14;
          local_268 = points + (points_count + -1);
          fVar13 = local_f0 + local_26c;
          local_158 = IVar14;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7123;
          _i1_2 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_268;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e713e;
          IVar14 = ::operator-(pIVar4,(ImVec2 *)&i1_2);
          pIVar8[(points_count + -1) * 4 + 3] = IVar14;
          local_168 = IVar14;
        }
        i2_2 = local_208->_VtxCurrentIdx;
        for (idx2_1 = 0; (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_2ac = 0.0;
          }
          else {
            local_2ac = (float)(idx2_1 + 1);
          }
          dm_1.y = local_2ac;
          if (idx2_1 + 1 == points_count) {
            local_2b0 = (float)local_208->_VtxCurrentIdx;
          }
          else {
            local_2b0 = (float)(i2_2 + 4);
          }
          dm_1.x = local_2b0;
          lVar11 = (long)(int)local_2ac;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e721a;
          _scale_1 = operator+(pIVar7 + (int)idx2_1,pIVar7 + lVar11);
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7236;
          local_188 = ::operator*((ImVec2 *)&scale_1,0.5);
          fVar13 = local_188.x * local_188.x + local_188.y * local_188.y;
          if (1e-06 < fVar13) {
            dm_out.x = 1.0 / fVar13;
            if (100.0 < dm_out.x) {
              dm_out.x = 100.0;
            }
            *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e72d4;
            operator*=(&local_188,dm_out.x);
          }
          fVar13 = local_f0 + 1.0;
          local_2c8[0] = (ImVec2)&local_188;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e72fb;
          dm_in = ::operator*(&local_188,fVar13);
          fVar13 = local_f0;
          IVar14 = local_2c8[0];
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7317;
          local_1a8 = ::operator*((ImVec2 *)IVar14,fVar13);
          lVar11 = (long)(int)dm_1.y;
          local_2b8 = &dm_in;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7341;
          IVar14 = operator+(points + lVar11,&dm_in);
          pIVar8[(int)dm_1.y << 2] = IVar14;
          lVar11 = (long)(int)dm_1.y;
          local_2c8[1] = (ImVec2)&local_1a8;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7386;
          IVar15 = operator+(points + lVar11,&local_1a8);
          IVar14 = local_2c8[1];
          pIVar8[(long)((int)dm_1.y << 2) + 1] = IVar15;
          lVar11 = (long)(int)dm_1.y;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e73c5;
          IVar14 = ::operator-(points + lVar11,(ImVec2 *)IVar14);
          pIVar4 = local_2b8;
          pIVar8[(long)((int)dm_1.y << 2) + 2] = IVar14;
          lVar11 = (long)(int)dm_1.y;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e7404;
          IVar14 = ::operator-(points + lVar11,pIVar4);
          pIVar8[(int)dm_1.y * 4 + 3] = IVar14;
          IVar9 = SUB42(dm_1.x,0);
          *local_208->_IdxWritePtr = IVar9 + 1;
          IVar10 = (ImDrawIdx)i2_2;
          local_208->_IdxWritePtr[1] = IVar10 + 1;
          local_208->_IdxWritePtr[2] = IVar10 + 2;
          local_208->_IdxWritePtr[3] = IVar10 + 2;
          local_208->_IdxWritePtr[4] = IVar9 + 2;
          local_208->_IdxWritePtr[5] = IVar9 + 1;
          local_208->_IdxWritePtr[6] = IVar9 + 1;
          local_208->_IdxWritePtr[7] = IVar10 + 1;
          local_208->_IdxWritePtr[8] = IVar10;
          local_208->_IdxWritePtr[9] = IVar10;
          local_208->_IdxWritePtr[10] = IVar9;
          local_208->_IdxWritePtr[0xb] = IVar9 + 1;
          local_208->_IdxWritePtr[0xc] = IVar9 + 2;
          local_208->_IdxWritePtr[0xd] = IVar10 + 2;
          local_208->_IdxWritePtr[0xe] = IVar10 + 3;
          local_208->_IdxWritePtr[0xf] = IVar10 + 3;
          local_208->_IdxWritePtr[0x10] = IVar9 + 3;
          local_208->_IdxWritePtr[0x11] = IVar9 + 2;
          local_208->_IdxWritePtr = local_208->_IdxWritePtr + 0x12;
          i2_2 = (int)dm_1.x;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          local_208->_VtxWritePtr->pos = pIVar8[vtx_count_1 << 2];
          local_208->_VtxWritePtr->uv = IVar1;
          local_208->_VtxWritePtr->col = uVar6;
          local_208->_VtxWritePtr[1].pos = pIVar8[vtx_count_1 * 4 + 1];
          local_208->_VtxWritePtr[1].uv = IVar1;
          local_208->_VtxWritePtr[1].col = col;
          local_208->_VtxWritePtr[2].pos = pIVar8[vtx_count_1 * 4 + 2];
          local_208->_VtxWritePtr[2].uv = IVar1;
          local_208->_VtxWritePtr[2].col = col;
          local_208->_VtxWritePtr[3].pos = pIVar8[vtx_count_1 * 4 + 3];
          local_208->_VtxWritePtr[3].uv = IVar1;
          local_208->_VtxWritePtr[3].col = uVar6;
          local_208->_VtxWritePtr = local_208->_VtxWritePtr + 4;
        }
      }
      else {
        if (!closed) {
          local_234 = 1.0;
          local_250 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e68c1;
          local_80 = ::operator*(pIVar7,1.0);
          pIVar4 = local_250;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e68d6;
          local_78 = operator+(pIVar4,&local_80);
          fVar13 = local_234;
          *pIVar8 = local_78;
          local_248 = points;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6905;
          local_90 = ::operator*(pIVar7,fVar13);
          pIVar4 = local_248;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6920;
          local_88 = ::operator-(pIVar4,&local_90);
          fVar13 = local_234;
          pIVar8[1] = local_88;
          local_240 = points + (points_count + -1);
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6960;
          local_a0 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_240;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e697b;
          IVar14 = operator+(pIVar4,&local_a0);
          fVar13 = local_234;
          pIVar8[points_count * 2 + -2] = IVar14;
          local_230 = points + (points_count + -1);
          local_98 = IVar14;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e69cd;
          _i1_1 = ::operator*(pIVar7 + (points_count + -1),fVar13);
          pIVar4 = local_230;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e69e8;
          IVar14 = ::operator-(pIVar4,(ImVec2 *)&i1_1);
          pIVar8[(points_count + -1) * 2 + 1] = IVar14;
          local_a8 = IVar14;
        }
        i2_1 = local_208->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_254 = 0.0;
          }
          else {
            local_254 = (float)(idx2 + 1);
          }
          dm.y = local_254;
          if (idx2 + 1 == points_count) {
            local_258 = (float)local_208->_VtxCurrentIdx;
          }
          else {
            local_258 = (float)(i2_1 + 3);
          }
          dm.x = local_258;
          lVar11 = (long)(int)local_254;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6ac3;
          _scale = operator+(pIVar7 + (int)idx2,pIVar7 + lVar11);
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6adf;
          local_c8 = ::operator*((ImVec2 *)&scale,0.5);
          local_d4 = local_c8.x * local_c8.x + local_c8.y * local_c8.y;
          if (1e-06 < local_d4) {
            local_d8 = 1.0 / local_d4;
            if (100.0 < local_d8) {
              local_d8 = 100.0;
            }
            fVar13 = local_d8;
            *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6b7d;
            operator*=(&local_c8,fVar13);
          }
          local_260 = &local_c8;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6b98;
          operator*=(&local_c8,1.0);
          pIVar4 = local_260;
          lVar11 = (long)(int)dm.y;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6bb3;
          IVar14 = operator+(points + lVar11,pIVar4);
          pIVar4 = local_260;
          pIVar8[(int)dm.y * 2] = IVar14;
          lVar11 = (long)(int)dm.y;
          local_e0 = IVar14;
          *(undefined8 *)((long)&uStack_2e0 + lVar3) = 0x1e6bf0;
          IVar14 = ::operator-(points + lVar11,pIVar4);
          pIVar8[(int)dm.y * 2 + 1] = IVar14;
          IVar9 = SUB42(dm.x,0);
          *local_208->_IdxWritePtr = IVar9;
          IVar10 = (ImDrawIdx)i2_1;
          local_208->_IdxWritePtr[1] = IVar10;
          local_208->_IdxWritePtr[2] = IVar10 + 2;
          local_208->_IdxWritePtr[3] = IVar10 + 2;
          local_208->_IdxWritePtr[4] = IVar9 + 2;
          local_208->_IdxWritePtr[5] = IVar9;
          local_208->_IdxWritePtr[6] = IVar9 + 1;
          local_208->_IdxWritePtr[7] = IVar10 + 1;
          local_208->_IdxWritePtr[8] = IVar10;
          local_208->_IdxWritePtr[9] = IVar10;
          local_208->_IdxWritePtr[10] = IVar9;
          local_208->_IdxWritePtr[0xb] = IVar9 + 1;
          local_208->_IdxWritePtr = local_208->_IdxWritePtr + 0xc;
          i2_1 = (int)dm.x;
          _half_inner_thickness = IVar14;
        }
        for (local_ec = 0; local_ec < points_count; local_ec = local_ec + 1) {
          local_208->_VtxWritePtr->pos = points[local_ec];
          local_208->_VtxWritePtr->uv = IVar1;
          local_208->_VtxWritePtr->col = col;
          local_208->_VtxWritePtr[1].pos = pIVar8[local_ec << 1];
          local_208->_VtxWritePtr[1].uv = IVar1;
          local_208->_VtxWritePtr[1].col = uVar6;
          local_208->_VtxWritePtr[2].pos = pIVar8[local_ec * 2 + 1];
          local_208->_VtxWritePtr[2].uv = IVar1;
          local_208->_VtxWritePtr[2].col = uVar6;
          local_208->_VtxWritePtr = local_208->_VtxWritePtr + 3;
        }
      }
      local_208->_VtxCurrentIdx = (uVar5 & 0xffff) + local_208->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness, bool anti_aliased)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    anti_aliased &= GImGui->Style.AntiAliasedLines;
    //if (ImGui::GetIO().KeyCtrl) anti_aliased = false; // Debug

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (anti_aliased)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            ImVec2 diff = points[i2] - points[i1];
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i1].x = diff.y;
            temp_normals[i1].y = -diff.x;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                dm *= AA_SIZE;
                temp_points[i2*2+0] = points[i2] + dm;
                temp_points[i2*2+1] = points[i2] - dm;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                ImVec2 dm_out = dm * (half_inner_thickness + AA_SIZE);
                ImVec2 dm_in = dm * half_inner_thickness;
                temp_points[i2*4+0] = points[i2] + dm_out;
                temp_points[i2*4+1] = points[i2] + dm_in;
                temp_points[i2*4+2] = points[i2] - dm_in;
                temp_points[i2*4+3] = points[i2] - dm_out;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];
            ImVec2 diff = p2 - p1;
            diff *= ImInvLength(diff, 1.0f);

            const float dx = diff.x * (thickness * 0.5f);
            const float dy = diff.y * (thickness * 0.5f);
            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}